

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_value.h
# Opt level: O0

void __thiscall docopt::value::value(value *this,value *other)

{
  value *other_local;
  value *this_local;
  
  this->kind = other->kind;
  Variant::Variant((Variant *)&(this->variant).strValue);
  switch(this->kind) {
  case Empty:
    break;
  case Bool:
    (this->variant).field4[0] = (other->variant).field4[0] & 1;
    break;
  case Long:
    (this->variant).longValue = (other->variant).longValue;
    break;
  case String:
    std::__cxx11::string::string
              ((string *)&(this->variant).strValue,(string *)&(other->variant).strValue);
    break;
  case StringList:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&(this->variant).strList,&(other->variant).strList);
  }
  return;
}

Assistant:

inline
	value::value(value const& other)
	: kind(other.kind)
	{
		switch (kind) {
			case Kind::String:
				new (&variant.strValue) std::string(other.variant.strValue);
				break;

			case Kind::StringList:
				new (&variant.strList) std::vector<std::string>(other.variant.strList);
				break;

			case Kind::Bool:
				variant.boolValue = other.variant.boolValue;
				break;

			case Kind::Long:
				variant.longValue = other.variant.longValue;
				break;

			case Kind::Empty:
			default:
				break;
		}
	}